

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void Assimp::Write(JSONWriter *out,aiMaterial *ai,bool is_elem)

{
  aiMaterialProperty *s_00;
  ostream *poVar1;
  stringstream *psVar2;
  long lVar3;
  ulong uVar4;
  pointer pcVar5;
  ulong uVar6;
  aiString s;
  char local_459;
  aiMaterial *local_458;
  ostream *local_450;
  stringstream *local_448;
  string *local_440;
  undefined1 local_438 [1032];
  
  JSONWriter::StartObj(out,is_elem);
  local_438._0_8_ = local_438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"properties","");
  JSONWriter::Key(out,(string *)local_438);
  if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  out->first = true;
  local_450 = (ostream *)&out->field_0x58;
  std::__ostream_insert<char,std::char_traits<char>>(local_450,"[\n",2);
  local_440 = &out->indent;
  std::__cxx11::string::push_back((char)local_440);
  if (ai->mNumProperties != 0) {
    local_448 = &out->buff;
    uVar4 = 0;
    local_458 = ai;
    do {
      pcVar5 = local_438 + 0x10;
      s_00 = ai->mProperties[uVar4];
      JSONWriter::StartObj(out,true);
      local_438._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"key","");
      JSONWriter::Key(out,(string *)local_438);
      if ((pointer)local_438._0_8_ != pcVar5) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      psVar2 = JSONWriter::LiteralToString(out,local_448,&s_00->mKey);
      local_438[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(psVar2 + 0x10),(char *)local_438,1);
      local_438._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"semantic","");
      JSONWriter::Key(out,(string *)local_438);
      if ((pointer)local_438._0_8_ != pcVar5) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      poVar1 = local_450;
      std::ostream::_M_insert<unsigned_long>((ulong)local_450);
      local_438[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_438,1);
      local_438._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"index","");
      JSONWriter::Key(out,(string *)local_438);
      if ((pointer)local_438._0_8_ != pcVar5) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      poVar1 = local_450;
      std::ostream::_M_insert<unsigned_long>((ulong)local_450);
      local_438[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_438,1);
      local_438._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"type","");
      JSONWriter::Key(out,(string *)local_438);
      if ((pointer)local_438._0_8_ != pcVar5) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      poVar1 = local_450;
      std::ostream::operator<<(local_450,s_00->mType);
      local_438[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_438,1);
      local_438._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"value","");
      JSONWriter::Key(out,(string *)local_438);
      if ((pointer)local_438._0_8_ != pcVar5) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      psVar2 = (stringstream *)local_450;
      switch(s_00->mType) {
      case aiPTI_Float:
        if (7 < s_00->mDataLength) {
          out->first = true;
          std::__ostream_insert<char,std::char_traits<char>>(local_450,"[\n",2);
          std::__cxx11::string::push_back((char)local_440);
          if (3 < s_00->mDataLength) {
            lVar3 = 0;
            uVar6 = 0;
            do {
              JSONWriter::Element<float>(out,(float *)(s_00->mData + lVar3));
              uVar6 = uVar6 + 1;
              lVar3 = lVar3 + 4;
            } while (uVar6 < s_00->mDataLength >> 2);
          }
          goto LAB_003a4359;
        }
        psVar2 = JSONWriter::LiteralToString(out,local_448,*(float *)s_00->mData);
        psVar2 = psVar2 + 0x10;
LAB_003a4445:
        local_438[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar2,(char *)local_438,1);
        ai = local_458;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assjson/json_exporter.cpp"
                      ,0x1f7,"void Assimp::Write(JSONWriter &, const aiMaterial &, bool)");
      case aiPTI_String:
        local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
        memset(local_438 + 5,0x1b,0x3ff);
        ai = local_458;
        aiGetMaterialString(local_458,(s_00->mKey).data,s_00->mSemantic,s_00->mIndex,
                            (aiString *)local_438);
        psVar2 = JSONWriter::LiteralToString(out,local_448,(aiString *)local_438);
        local_459 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(psVar2 + 0x10),&local_459,1);
        break;
      case aiPTI_Integer:
        if (s_00->mDataLength < 8) {
          std::ostream::operator<<(local_450,*(int *)s_00->mData);
          goto LAB_003a4445;
        }
        out->first = true;
        std::__ostream_insert<char,std::char_traits<char>>(local_450,"[\n",2);
        std::__cxx11::string::push_back((char)local_440);
        if (3 < s_00->mDataLength) {
          lVar3 = 0;
          uVar6 = 0;
          do {
            JSONWriter::Element<int>(out,(int *)(s_00->mData + lVar3));
            uVar6 = uVar6 + 1;
            lVar3 = lVar3 + 4;
          } while (uVar6 < s_00->mDataLength >> 2);
        }
LAB_003a4359:
        JSONWriter::EndArray(out);
        ai = local_458;
        break;
      case aiPTI_Buffer:
        JSONWriter::SimpleValue(out,s_00->mData,(ulong)s_00->mDataLength);
        ai = local_458;
      }
      JSONWriter::EndObj(out);
      uVar4 = uVar4 + 1;
    } while (uVar4 < ai->mNumProperties);
  }
  JSONWriter::EndArray(out);
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiMaterial& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("properties");
    out.StartArray();
    for (unsigned int i = 0; i < ai.mNumProperties; ++i) {
        const aiMaterialProperty* const prop = ai.mProperties[i];
        out.StartObj(true);
        out.Key("key");
        out.SimpleValue(prop->mKey);
        out.Key("semantic");
        out.SimpleValue(prop->mSemantic);
        out.Key("index");
        out.SimpleValue(prop->mIndex);

        out.Key("type");
        out.SimpleValue(prop->mType);

        out.Key("value");
        switch (prop->mType) {
            case aiPTI_Float:
                if (prop->mDataLength / sizeof(float) > 1) {
                    out.StartArray();
                    for (unsigned int i = 0; i < prop->mDataLength / sizeof(float); ++i) {
                        out.Element(reinterpret_cast<float*>(prop->mData)[i]);
                    }
                    out.EndArray();
                }
                else {
                    out.SimpleValue(*reinterpret_cast<float*>(prop->mData));
                }
                break;

            case aiPTI_Integer:
                if (prop->mDataLength / sizeof(int) > 1) {
                    out.StartArray();
                    for (unsigned int i = 0; i < prop->mDataLength / sizeof(int); ++i) {
                        out.Element(reinterpret_cast<int*>(prop->mData)[i]);
                    }
                    out.EndArray();
                } else {
                    out.SimpleValue(*reinterpret_cast<int*>(prop->mData));
                }
                break;

            case aiPTI_String:
                {
                    aiString s;
                    aiGetMaterialString(&ai, prop->mKey.data, prop->mSemantic, prop->mIndex, &s);
                    out.SimpleValue(s);
                }
                break;
            case aiPTI_Buffer:
                {
                    // binary data is written as series of hex-encoded octets
                    out.SimpleValue(prop->mData, prop->mDataLength);
                }
                break;
            default:
                assert(false);
        }

        out.EndObj();
    }

    out.EndArray();
    out.EndObj();
}